

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsTcpServer.cpp
# Opt level: O0

void __thiscall xs::TcpServer::runServer(TcpServer *this)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  socklen_t *in_RCX;
  sockaddr *extraout_RDX;
  sockaddr *__addr;
  sockaddr *extraout_RDX_00;
  ConnectionHandler *handler;
  SocketAddress local_20;
  SocketAddress clientAddr;
  Socket *clientSocket;
  TcpServer *this_local;
  
  clientAddr.m_address = (deSocketAddress *)0x0;
  de::SocketAddress::SocketAddress(&local_20);
  __addr = extraout_RDX;
  while( true ) {
    iVar1 = de::Socket::accept(&this->m_socket,(int)&local_20,__addr,in_RCX);
    clientAddr.m_address = (deSocketAddress *)CONCAT44(extraout_var,iVar1);
    if (clientAddr.m_address == (deSocketAddress *)0x0) break;
    iVar1 = (*this->_vptr_TcpServer[2])(this,clientAddr.m_address,&local_20);
    addLiveConnection(this,(ConnectionHandler *)CONCAT44(extraout_var_00,iVar1));
    de::Thread::start((Thread *)CONCAT44(extraout_var_00,iVar1));
    deleteDoneConnections(this);
    __addr = extraout_RDX_00;
  }
  deleteDoneConnections(this);
  de::SocketAddress::~SocketAddress(&local_20);
  return;
}

Assistant:

void TcpServer::runServer (void)
{
	de::Socket*			clientSocket	= DE_NULL;
	de::SocketAddress	clientAddr;

	while ((clientSocket = m_socket.accept(clientAddr)) != DE_NULL)
	{
		ConnectionHandler* handler = DE_NULL;

		try
		{
			handler = createHandler(clientSocket, clientAddr);
		}
		catch (...)
		{
			delete clientSocket;
			throw;
		}

		try
		{
			addLiveConnection(handler);
		}
		catch (...)
		{
			delete handler;
			throw;
		}

		// Start handler.
		handler->start();

		// Perform connection list cleanup.
		deleteDoneConnections();
	}

	// One more cleanup pass.
	deleteDoneConnections();
}